

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char> __thiscall
fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,string_view bytes,format_specs *specs)

{
  size_t size;
  basic_appender<char> bVar1;
  anon_class_16_1_a7b7af8b local_48;
  basic_appender<char> local_38;
  format_specs *local_30;
  format_specs *specs_local;
  string_view bytes_local;
  basic_appender<char> out_local;
  
  bytes_local.data_ = bytes.data_;
  local_38.container = (buffer<char> *)this;
  local_30 = (format_specs *)bytes.size_;
  specs_local = (format_specs *)out.container;
  bytes_local.size_ = (size_t)this;
  size = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  local_48.bytes.data_ = (char *)specs_local;
  local_48.bytes.size_ = (size_t)bytes_local.data_;
  bVar1 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (local_38,(format_specs *)bytes.size_,size,&local_48);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write_bytes(OutputIt out, string_view bytes,
                               const format_specs& specs = {}) -> OutputIt {
  return write_padded<Char, default_align>(
      out, specs, bytes.size(), [bytes](reserve_iterator<OutputIt> it) {
        const char* data = bytes.data();
        return copy<Char>(data, data + bytes.size(), it);
      });
}